

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockNodeCalcTabBarLayout
               (ImGuiDockNode *node,ImRect *out_title_rect,ImRect *out_tab_bar_rect,
               ImVec2 *out_window_menu_button_pos)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  ImGuiContext *pIVar4;
  ImVec2 IVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  pIVar4 = GImGui;
  fVar7 = (node->Pos).x;
  fVar1 = (node->Pos).y;
  fVar6 = (node->Size).x + fVar7;
  fVar8 = (GImGui->Style).FramePadding.y;
  fVar8 = fVar8 + fVar8 + GImGui->FontSize + fVar1;
  if (out_title_rect != (ImRect *)0x0) {
    (out_title_rect->Min).x = fVar7;
    (out_title_rect->Min).y = fVar1;
    (out_title_rect->Max).x = fVar6;
    (out_title_rect->Max).y = fVar8;
  }
  fVar2 = (pIVar4->Style).FramePadding.x;
  fVar6 = fVar6 - fVar2;
  uVar3 = *(uint *)&node->field_0xb8;
  if ((uVar3 >> 0xb & 1) != 0) {
    fVar6 = fVar6 - pIVar4->FontSize;
  }
  fVar9 = fVar7 + fVar2;
  if ((uVar3 >> 0xc & 1) != 0) {
    if ((pIVar4->Style).WindowMenuButtonPosition == 0) {
      fVar9 = fVar9 + pIVar4->FontSize;
    }
    else if (((uVar3 >> 0xc & 1) != 0) && ((pIVar4->Style).WindowMenuButtonPosition == 1)) {
      fVar7 = fVar6 - (fVar2 + pIVar4->FontSize);
      fVar6 = fVar7;
    }
  }
  if (out_tab_bar_rect != (ImRect *)0x0) {
    (out_tab_bar_rect->Min).x = fVar9;
    (out_tab_bar_rect->Min).y = fVar1;
    (out_tab_bar_rect->Max).x = fVar6;
    (out_tab_bar_rect->Max).y = fVar8;
  }
  if (out_window_menu_button_pos != (ImVec2 *)0x0) {
    IVar5.y = fVar1;
    IVar5.x = fVar7;
    *out_window_menu_button_pos = IVar5;
  }
  return;
}

Assistant:

static void ImGui::DockNodeCalcTabBarLayout(const ImGuiDockNode* node, ImRect* out_title_rect, ImRect* out_tab_bar_rect, ImVec2* out_window_menu_button_pos)
{
    ImGuiContext& g = *GImGui;
    ImRect r = ImRect(node->Pos.x, node->Pos.y, node->Pos.x + node->Size.x, node->Pos.y + g.FontSize + g.Style.FramePadding.y * 2.0f);
    if (out_title_rect) { *out_title_rect = r; }

    ImVec2 window_menu_button_pos = r.Min;
    r.Min.x += g.Style.FramePadding.x;
    r.Max.x -= g.Style.FramePadding.x;
    if (node->HasCloseButton)
    {
        r.Max.x -= g.FontSize;// +1.0f; // In DockNodeUpdateTabBar() we currently display a disabled close button even if there is none.
    }
    if (node->HasWindowMenuButton && g.Style.WindowMenuButtonPosition == ImGuiDir_Left)
    {
        r.Min.x += g.FontSize; // + g.Style.ItemInnerSpacing.x; // <-- Adding ItemInnerSpacing makes the title text moves slightly when in a docking tab bar. Instead we adjusted RenderArrowDockMenu()
    }
    else if (node->HasWindowMenuButton && g.Style.WindowMenuButtonPosition == ImGuiDir_Right)
    {
        r.Max.x -= g.FontSize + g.Style.FramePadding.x;
        window_menu_button_pos = ImVec2(r.Max.x, r.Min.y);
    }
    if (out_tab_bar_rect) { *out_tab_bar_rect = r; }
    if (out_window_menu_button_pos) { *out_window_menu_button_pos = window_menu_button_pos; }
}